

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PatternCaseItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PatternCaseItemSyntax,slang::syntax::PatternSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,PatternSyntax *args,Token *args_1,ExpressionSyntax **args_2,
          Token *args_3,StatementSyntax *args_4)

{
  Token tripleAnd;
  Token colon;
  PatternCaseItemSyntax *pPVar1;
  Info *in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  Info *in_RDI;
  long in_R8;
  PatternCaseItemSyntax *in_R9;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pPVar1 = (PatternCaseItemSyntax *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  tripleAnd.info = in_RCX;
  tripleAnd.kind = (short)in_R8;
  tripleAnd._2_1_ = (char)((ulong)in_R8 >> 0x10);
  tripleAnd.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  tripleAnd.rawLen = (int)((ulong)in_R8 >> 0x20);
  colon.info = in_RDI;
  colon.kind = (short)in_RSI;
  colon._2_1_ = (char)((ulong)in_RSI >> 0x10);
  colon.numFlags.raw = (char)((ulong)in_RSI >> 0x18);
  colon.rawLen = (int)((ulong)in_RSI >> 0x20);
  slang::syntax::PatternCaseItemSyntax::PatternCaseItemSyntax
            (in_R9,(PatternSyntax *)in_RDX[1],tripleAnd,(ExpressionSyntax *)*in_RDX,colon,
             *(StatementSyntax **)(in_R8 + 8));
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }